

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  TestEventRepeater *pTVar1;
  UnitTestImpl *pUVar2;
  __time_t _Var3;
  bool bVar4;
  Test *this_00;
  OsStackTraceGetterInterface *pOVar5;
  undefined **ppuVar6;
  long lVar7;
  timeval now;
  timeval local_40;
  
  if (this->should_run_ == true) {
    UnitTest::GetInstance();
    pUVar2 = UnitTest::GetInstance::instance.impl_;
    (UnitTest::GetInstance::instance.impl_)->current_test_info_ = this;
    UnitTest::GetInstance();
    pTVar1 = ((UnitTest::GetInstance::instance.impl_)->listeners_).repeater_;
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[7])(pTVar1);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    _Var3 = local_40.tv_sec;
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_usec),8);
    if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar6 = &PTR__OsStackTraceGetterInterface_00732650;
      pOVar5->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_00732650;
      pUVar2->os_stack_trace_getter_ = pOVar5;
    }
    else {
      ppuVar6 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar6)[3])();
    this_00 = internal::
              HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                        (this->factory_,0x11,(char *)0x0);
    bVar4 = Test::HasFatalFailure();
    if (!bVar4) {
      Test::Run(this_00);
    }
    if (pUVar2->os_stack_trace_getter_ == (OsStackTraceGetterInterface *)0x0) {
      pOVar5 = (OsStackTraceGetterInterface *)operator_new(8);
      ppuVar6 = &PTR__OsStackTraceGetterInterface_00732650;
      pOVar5->_vptr_OsStackTraceGetterInterface =
           (_func_int **)&PTR__OsStackTraceGetterInterface_00732650;
      pUVar2->os_stack_trace_getter_ = pOVar5;
    }
    else {
      ppuVar6 = pUVar2->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface;
    }
    (*((_func_int **)ppuVar6)[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>(this_00,0x51ab7a,(char *)0x0);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    (this->result_).elapsed_time_ =
         (local_40.tv_sec - _Var3) * 1000 +
         local_40.tv_usec / 1000 + ((lVar7 >> 7) - (lVar7 >> 0x3f));
    (*(pTVar1->super_TestEventListener)._vptr_TestEventListener[9])(pTVar1,this);
    pUVar2->current_test_info_ = (TestInfo *)0x0;
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test if the constructor didn't generate a fatal failure.
  // Note that the object will not be null
  if (!Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

    // Deletes the test object.
    impl->os_stack_trace_getter()->UponLeavingGTest();
    internal::HandleExceptionsInMethodIfSupported(
        test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}